

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void grabForPopup(QWidget *popup)

{
  QWidgetPrivate *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_40;
  Stream *local_38;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = qt_widget_private(popup);
  popupGrabOk = QWidgetPrivate::stealKeyboardGrab(pQVar1,true);
  if (popupGrabOk) {
    pQVar1 = qt_widget_private(popup);
    popupGrabOk = QWidgetPrivate::stealMouseGrab(pQVar1,true);
    if (!popupGrabOk) {
      ungrabKeyboardForPopup(popup);
    }
  }
  lcWidgetPopup();
  if (((byte)lcWidgetPopup::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_40,"grabbed mouse and keyboard?");
    pQVar2 = QDebug::operator<<(pQVar2,popupGrabOk);
    pQVar2 = QDebug::operator<<(pQVar2,"for popup");
    local_38 = pQVar2->stream;
    *(int *)(local_38 + 0x28) = *(int *)(local_38 + 0x28) + 1;
    operator<<((Stream *)local_30,(QWidget *)&local_38);
    QDebug::~QDebug((QDebug *)local_30);
    QDebug::~QDebug((QDebug *)&local_38);
    QDebug::~QDebug(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void grabForPopup(QWidget *popup)
{
    Q_ASSERT(popup->testAttribute(Qt::WA_WState_Created));
    popupGrabOk = qt_widget_private(popup)->stealKeyboardGrab(true);
    if (popupGrabOk) {
        popupGrabOk = qt_widget_private(popup)->stealMouseGrab(true);
        if (!popupGrabOk) {
            // transfer grab back to the keyboard grabber if any
            ungrabKeyboardForPopup(popup);
        }
    }
    qCDebug(lcWidgetPopup) << "grabbed mouse and keyboard?" << popupGrabOk << "for popup" << popup;
}